

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ae642::NodeStoringImplicitDepLoader::ProcessDepfileDeps
          (NodeStoringImplicitDepLoader *this,Edge *edge,
          vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins,string *err)

{
  char *path;
  State *this_00;
  bool bVar1;
  pointer pSVar2;
  reference pSVar3;
  Node *local_48;
  Node *node;
  uint64_t slash_bits;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_30
  ;
  iterator i;
  string *err_local;
  vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins_local;
  Edge *edge_local;
  NodeStoringImplicitDepLoader *this_local;
  
  i._M_current = (StringPiece *)err;
  local_30._M_current =
       (StringPiece *)std::vector<StringPiece,_std::allocator<StringPiece>_>::begin(depfile_ins);
  while( true ) {
    slash_bits = (uint64_t)std::vector<StringPiece,_std::allocator<StringPiece>_>::end(depfile_ins);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                        *)&slash_bits);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
             ::operator->(&local_30);
    path = pSVar2->str_;
    pSVar2 = __gnu_cxx::
             __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
             ::operator->(&local_30);
    CanonicalizePath(path,&pSVar2->len_,(uint64_t *)&node);
    this_00 = (this->super_ImplicitDepLoader).state_;
    pSVar3 = __gnu_cxx::
             __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
             ::operator*(&local_30);
    local_48 = State::GetNode(this_00,*pSVar3,(uint64_t)node);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this->dep_nodes_output_,&local_48);
    __gnu_cxx::
    __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>::
    operator++(&local_30);
  }
  return true;
}

Assistant:

bool NodeStoringImplicitDepLoader::ProcessDepfileDeps(
    Edge* edge, std::vector<StringPiece>* depfile_ins, std::string* err) {
  for (std::vector<StringPiece>::iterator i = depfile_ins->begin();
       i != depfile_ins->end(); ++i) {
    uint64_t slash_bits;
    CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
    Node* node = state_->GetNode(*i, slash_bits);
    dep_nodes_output_->push_back(node);
  }
  return true;
}